

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O2

AlphaVector * __thiscall
AlphaVectorWeighted::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorWeighted *this,JointBeliefInterface *b,
          Index a,GaoVectorSet *G,QFunctionsDiscrete *Q)

{
  double dVar1;
  ulong uVar2;
  E *this_00;
  uint i;
  uint i_00;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  allocator_type local_bd;
  Index local_bc;
  vector<double,_std::allocator<double>_> valuesWeighted;
  AlphaVector alphaPOMDP;
  value_type_conflict3 local_60;
  AlphaVector alphaBG;
  
  if ((this->super_AlphaVectorPOMDP).field_0x20 != '\0') {
    AlphaVectorPOMDP::BeliefBackup(&alphaPOMDP,&this->super_AlphaVectorPOMDP,b,a,G);
    AlphaVectorPlanning::QFunctionsToValueFunction((ValueFunctionPOMDPDiscrete *)&valuesWeighted,Q);
    AlphaVectorBG::BeliefBackup
              (&alphaBG,(AlphaVectorBG *)&(this->super_AlphaVectorPOMDP).field_0x8,b,a,G,
               (ValueFunctionPOMDPDiscrete *)&valuesWeighted,BGIP_SOLVER_EXHAUSTIVE);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&valuesWeighted);
    local_60 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&valuesWeighted,
               (ulong)((long)alphaPOMDP._m_values.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)alphaPOMDP._m_values.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff,&local_60,
               &local_bd);
    i_00 = 0;
    local_bc = a;
    while (uVar2 = (ulong)((long)alphaPOMDP._m_values.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)alphaPOMDP._m_values.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3, i_00 != (uint)uVar2) {
      uVar2 = (ulong)i_00;
      dVar1 = *(double *)
               (*(long *)(*(long *)&(this->super_AlphaVectorPOMDP).field_0x40 + (ulong)a * 0x18) +
               uVar2 * 8);
      dVar3 = AlphaVector::GetValue(&alphaPOMDP,i_00);
      dVar4 = AlphaVector::GetValue(&alphaBG,i_00);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar3;
      i_00 = i_00 + 1;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (1.0 - dVar1) * dVar4;
      auVar5 = vfmadd213sd_fma(auVar7,auVar6,auVar5);
      valuesWeighted.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = auVar5._0_8_;
    }
    AlphaVector::AlphaVector(__return_storage_ptr__,uVar2 & 0xffffffff);
    AlphaVector::SetValues(__return_storage_ptr__,&valuesWeighted);
    __return_storage_ptr__->_m_action = local_bc;
    AlphaVector::SetBetaI(__return_storage_ptr__,alphaBG._m_betaI);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&valuesWeighted.super__Vector_base<double,_std::allocator<double>_>);
    AlphaVector::~AlphaVector(&alphaBG);
    AlphaVector::~AlphaVector(&alphaPOMDP);
    return __return_storage_ptr__;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"AlphaVectorWeighted::BeliefBackup not initialized");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

AlphaVector
AlphaVectorWeighted::BeliefBackup(const JointBeliefInterface &b,
                                  Index a,
                                  const GaoVectorSet &G,
                                  const QFunctionsDiscrete &Q) const
{
    if(!_m_initialized)
        throw(E("AlphaVectorWeighted::BeliefBackup not initialized"));

    AlphaVector alphaPOMDP=AlphaVectorPOMDP::BeliefBackup(b,a,G);
    AlphaVector alphaBG=
        AlphaVectorBG::BeliefBackup(b,a,G,
                                    QFunctionsToValueFunction(Q),
                                    BGIP_SOLVER_EXHAUSTIVE);

    vector<double> valuesWeighted(alphaPOMDP.GetNrValues(),0);
    double w;
#if 0
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
        valuesWeighted[i]=(_m_weights[i] * alphaPOMDP.GetValue(i) +
                           (1-_m_weights[i]) * alphaBG.GetValue(i));
#else
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
    {
        w=_m_weightsBackProjected[a][i];
        valuesWeighted[i]=(w * alphaPOMDP.GetValue(i) +
                           (1-w) * alphaBG.GetValue(i));
    }
#endif
    AlphaVector alphaWeighted(alphaPOMDP.GetNrValues());
    alphaWeighted.SetValues(valuesWeighted);
    alphaWeighted.SetAction(a);
    alphaWeighted.SetBetaI(alphaBG.GetBetaI());

#if DEBUG_AlphaVectorWeighted
    double Vpomdp=BeliefValue::GetValue(b,alphaPOMDP),
        Vbg=BeliefValue::GetValue(b,alphaBG),
        Vweighted=BeliefValue::GetValue(b,alphaWeighted);

    cout << "AlphaVectorWeighted::BeliefBackup"
         << " for a " << a
#if 0
         << alphaWeighted.GetAction() << " bI "
         << alphaWeighted.GetBetaI() << " Vpomdp " << Vpomdp
         << " Vbg " << Vbg << " Vweighted " << Vweighted
#endif
         << " b " << b.SoftPrint() << " alpha " << alphaWeighted.SoftPrint()
         << endl;
#endif

    return(alphaWeighted);
}